

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

chirc_user_t * chirc_ctx_get_user(chirc_ctx_t *ctx,char *nick)

{
  UT_hash_table *pUVar1;
  UT_hash_handle *pUVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  chirc_user_t *pcVar11;
  
  sVar4 = strlen(nick);
  if (ctx->users != (chirc_user_t *)0x0) {
    pbVar5 = (byte *)(nick + 10);
    uVar10 = 0x9e3779b9;
    uVar6 = 0xfeedbeef;
    uVar7 = 0x9e3779b9;
    uVar9 = sVar4 & 0xffffffff;
    while (uVar8 = (uint)uVar9, 0xb < uVar8) {
      uVar6 = uVar6 + *(int *)(pbVar5 + -2);
      uVar10 = uVar6 >> 0xd ^
               ((uVar10 + *(int *)(pbVar5 + -10)) - (uVar7 + *(int *)(pbVar5 + -6))) - uVar6;
      uVar7 = uVar10 << 8 ^ ((uVar7 + *(int *)(pbVar5 + -6)) - uVar6) - uVar10;
      uVar6 = uVar7 >> 0xd ^ (uVar6 - uVar10) - uVar7;
      uVar10 = uVar6 >> 0xc ^ (uVar10 - uVar7) - uVar6;
      uVar7 = uVar10 << 0x10 ^ (uVar7 - uVar6) - uVar10;
      uVar6 = uVar7 >> 5 ^ (uVar6 - uVar10) - uVar7;
      uVar10 = uVar6 >> 3 ^ (uVar10 - uVar7) - uVar6;
      uVar7 = uVar10 << 10 ^ (uVar7 - uVar6) - uVar10;
      uVar6 = uVar7 >> 0xf ^ (uVar6 - uVar10) - uVar7;
      pbVar5 = pbVar5 + 0xc;
      uVar9 = (ulong)(uVar8 - 0xc);
    }
    uVar6 = uVar6 + (uint)sVar4;
    switch(uVar8) {
    case 0xb:
      uVar6 = (uint)*pbVar5 * 0x1000000 + uVar6;
    case 10:
      uVar6 = (uint)pbVar5[-1] * 0x10000 + uVar6;
    case 9:
      uVar6 = (uint)pbVar5[-2] * 0x100 + uVar6;
    case 8:
      uVar7 = (uint)pbVar5[-3] * 0x1000000 + uVar7;
    case 7:
      uVar7 = (uint)pbVar5[-4] * 0x10000 + uVar7;
    case 6:
      uVar7 = (uint)pbVar5[-5] * 0x100 + uVar7;
    case 5:
      uVar7 = pbVar5[-6] + uVar7;
    case 4:
      uVar10 = (uint)pbVar5[-7] * 0x1000000 + uVar10;
    case 3:
      uVar10 = (uint)pbVar5[-8] * 0x10000 + uVar10;
    case 2:
      uVar10 = (uint)pbVar5[-9] * 0x100 + uVar10;
    case 1:
      uVar10 = pbVar5[-10] + uVar10;
    default:
      uVar10 = uVar6 >> 0xd ^ (uVar10 - uVar6) - uVar7;
      uVar8 = uVar10 << 8 ^ (uVar7 - uVar6) - uVar10;
      uVar7 = uVar8 >> 0xd ^ (uVar6 - uVar10) - uVar8;
      uVar6 = uVar7 >> 0xc ^ (uVar10 - uVar8) - uVar7;
      uVar10 = uVar6 << 0x10 ^ (uVar8 - uVar7) - uVar6;
      uVar7 = uVar10 >> 5 ^ (uVar7 - uVar6) - uVar10;
      uVar6 = uVar7 >> 3 ^ (uVar6 - uVar10) - uVar7;
      uVar10 = uVar6 << 10 ^ (uVar10 - uVar7) - uVar6;
      uVar10 = uVar10 >> 0xf ^ uVar7 - (uVar6 + uVar10);
      pUVar1 = (ctx->users->hh).tbl;
      pUVar2 = pUVar1->buckets[pUVar1->num_buckets - 1 & uVar10].hh_head;
      if (pUVar2 == (UT_hash_handle *)0x0) {
        pcVar11 = (chirc_user_t *)0x0;
      }
      else {
        pcVar11 = (chirc_user_t *)((long)pUVar2 - pUVar1->hho);
      }
    }
    while (pcVar11 != (chirc_user_t *)0x0) {
      if ((((pcVar11->hh).hashv == uVar10) && ((pcVar11->hh).keylen == (uint)sVar4)) &&
         (iVar3 = bcmp((pcVar11->hh).key,nick,sVar4 & 0xffffffff), iVar3 == 0)) {
        return pcVar11;
      }
      pUVar2 = (pcVar11->hh).hh_next;
      pcVar11 = (chirc_user_t *)0x0;
      if (pUVar2 != (UT_hash_handle *)0x0) {
        pcVar11 = (chirc_user_t *)((long)pUVar2 - pUVar1->hho);
      }
    }
  }
  return (chirc_user_t *)0x0;
}

Assistant:

chirc_user_t* chirc_ctx_get_user(chirc_ctx_t *ctx, char *nick)
{
    chirc_user_t *user;

    HASH_FIND_STR(ctx->users, nick, user);

    return user;
}